

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_normal(REF_GRID ref_grid,REF_INT node,REF_DBL *normal)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined8 uVar5;
  REF_INT cell;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  REF_DBL area;
  double local_d8;
  undefined8 uStack_d0;
  REF_DBL tri_norm [3];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  normal[2] = 0.0;
  auVar9 = ZEXT816(0);
  *(undefined1 (*) [16])normal = auVar9;
  uVar7 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar7 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar7 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar7 = (ulong)uVar4;
      }
    }
  }
  dVar10 = 0.0;
  dVar13 = 0.0;
  uVar5 = 0;
  while ((int)uVar7 != -1) {
    local_d8 = dVar13;
    uStack_d0 = uVar5;
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) {
      uVar7 = (ulong)uVar4;
      pcVar6 = "cell nodes";
      uVar5 = 0x5b7;
      goto LAB_001ae1ce;
    }
    uVar4 = ref_node_tri_normal(ref_node,nodes,tri_norm);
    if (uVar4 != 0) {
      uVar7 = (ulong)uVar4;
      pcVar6 = "cell nodes";
      uVar5 = 0x5b8;
      goto LAB_001ae1ce;
    }
    uVar4 = ref_node_tri_area(ref_node,nodes,&area);
    if (uVar4 != 0) {
      uVar7 = (ulong)uVar4;
      pcVar6 = "area";
      uVar5 = 0x5b9;
      goto LAB_001ae1ce;
    }
    auVar9._0_8_ = area * tri_norm[0] + *normal;
    auVar9._8_8_ = area * tri_norm[1] + normal[1];
    *(undefined1 (*) [16])normal = auVar9;
    dVar13 = local_d8 + area;
    dVar10 = area * tri_norm[2] + normal[2];
    normal[2] = dVar10;
    pRVar2 = ref_cell->ref_adj->item;
    uVar7 = (ulong)pRVar2[(int)uVar7].next;
    cell = -1;
    uVar5 = uStack_d0;
    if (uVar7 != 0xffffffffffffffff) {
      cell = pRVar2[uVar7].ref;
    }
  }
  dVar11 = dVar13 * 1e+20;
  if (dVar11 <= -dVar11) {
    dVar11 = -dVar11;
  }
  dVar8 = auVar9._0_8_;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  dVar12 = auVar9._8_8_;
  if (dVar8 < dVar11) {
    if (dVar12 <= -dVar12) {
      dVar12 = -dVar12;
    }
    if (dVar12 < dVar11) {
      dVar8 = dVar10;
      if (dVar10 <= -dVar10) {
        dVar8 = -dVar10;
      }
      if (dVar8 < dVar11) {
        auVar3._8_8_ = dVar13;
        auVar3._0_8_ = dVar13;
        auVar9 = divpd(auVar9,auVar3);
        *(undefined1 (*) [16])normal = auVar9;
        normal[2] = dVar10 / dVar13;
        uVar4 = ref_math_normalize(normal);
        if (uVar4 == 0) {
          return 0;
        }
        uVar7 = (ulong)uVar4;
        pcVar6 = "norm";
        uVar5 = 0x5c5;
LAB_001ae1ce:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               uVar5,"ref_recon_normal",uVar7,pcVar6);
        return (REF_STATUS)uVar7;
      }
    }
  }
  *normal = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_recon_normal(REF_GRID ref_grid, REF_INT node,
                                    REF_DBL *normal) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL total, area, tri_norm[3];

  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  total = 0.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, tri_norm), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    normal[0] += area * tri_norm[0];
    normal[1] += area * tri_norm[1];
    normal[2] += area * tri_norm[2];
    total += area;
  }
  if (ref_math_divisible(normal[0], total) &&
      ref_math_divisible(normal[1], total) &&
      ref_math_divisible(normal[2], total)) {
    normal[0] /= total;
    normal[1] /= total;
    normal[2] /= total;
    RSS(ref_math_normalize(normal), "norm");
  } else {
    normal[0] = 0.0;
    normal[1] = 0.0;
    normal[2] = 0.0;
    return REF_DIV_ZERO;
  }
  return REF_SUCCESS;
}